

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cecSat.c
# Opt level: O1

void Cec2_ManSimAlloc(Gia_Man_t *p,int nWords)

{
  Vec_Wrd_t *pVVar1;
  word *pwVar2;
  word *pwVar3;
  int iVar4;
  int iVar5;
  long lVar6;
  
  if (p->vSims != (Vec_Wrd_t *)0x0) {
    pwVar2 = p->vSims->pArray;
    if (pwVar2 != (word *)0x0) {
      free(pwVar2);
      p->vSims->pArray = (word *)0x0;
    }
    if (p->vSims != (Vec_Wrd_t *)0x0) {
      free(p->vSims);
      p->vSims = (Vec_Wrd_t *)0x0;
    }
  }
  if (p->vSimsPi != (Vec_Wrd_t *)0x0) {
    pwVar2 = p->vSimsPi->pArray;
    if (pwVar2 != (word *)0x0) {
      free(pwVar2);
      p->vSimsPi->pArray = (word *)0x0;
    }
    if (p->vSimsPi != (Vec_Wrd_t *)0x0) {
      free(p->vSimsPi);
      p->vSimsPi = (Vec_Wrd_t *)0x0;
    }
  }
  lVar6 = (long)nWords * (long)p->nObjs;
  pVVar1 = (Vec_Wrd_t *)malloc(0x10);
  iVar4 = (int)lVar6;
  iVar5 = iVar4;
  if (iVar4 - 1U < 0xf) {
    iVar5 = 0x10;
  }
  pVVar1->nSize = 0;
  pVVar1->nCap = iVar5;
  if (iVar5 == 0) {
    pwVar2 = (word *)0x0;
  }
  else {
    pwVar2 = (word *)malloc((long)iVar5 << 3);
  }
  pVVar1->pArray = pwVar2;
  pVVar1->nSize = iVar4;
  pwVar3 = (word *)0x0;
  memset(pwVar2,0,lVar6 * 8);
  p->vSims = pVVar1;
  iVar5 = p->vCis->nSize * nWords;
  iVar4 = iVar5 * 4;
  pVVar1 = (Vec_Wrd_t *)malloc(0x10);
  if (iVar5 * 4 - 1U < 0xf) {
    iVar4 = 0x10;
  }
  pVVar1->nSize = 0;
  pVVar1->nCap = iVar4;
  if (iVar4 != 0) {
    pwVar3 = (word *)malloc((long)iVar4 << 3);
  }
  pVVar1->pArray = pwVar3;
  p->vSimsPi = pVVar1;
  p->nSimWords = nWords;
  return;
}

Assistant:

void Cec2_ManSimAlloc( Gia_Man_t * p, int nWords )
{
    Vec_WrdFreeP( &p->vSims );
    Vec_WrdFreeP( &p->vSimsPi );
    p->vSims   = Vec_WrdStart( Gia_ManObjNum(p) * nWords );
    p->vSimsPi = Vec_WrdAlloc( Gia_ManCiNum(p) * nWords * 4 ); // storage for CI patterns
    p->nSimWords = nWords;
}